

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_adapt.c
# Opt level: O0

int arkAdaptImpGus(ARKodeHAdaptMem hadapt_mem,int k,long nst,realtype hcur,realtype ecur,
                  realtype *hnew)

{
  double *in_RCX;
  long in_RDX;
  long in_RDI;
  double in_XMM0_Qa;
  realtype rVar1;
  double base;
  realtype rVar2;
  realtype h_acc;
  realtype hrat;
  realtype e2;
  realtype e1;
  realtype k2;
  realtype k1;
  realtype in_stack_ffffffffffffff68;
  double local_60;
  
  if (in_RDX < 2) {
    rVar1 = SUNRpowerR(in_stack_ffffffffffffff68,9.05918965840768e-317);
    local_60 = in_XMM0_Qa * rVar1;
  }
  else {
    base = in_XMM0_Qa * (in_XMM0_Qa / *(double *)(in_RDI + 0x50));
    rVar1 = SUNRpowerR(base,9.05936702797454e-317);
    rVar2 = SUNRpowerR(base,9.05938432027214e-317);
    local_60 = base * rVar1 * rVar2;
  }
  *in_RCX = local_60;
  return 0;
}

Assistant:

int arkAdaptImpGus(ARKodeHAdaptMem hadapt_mem, int k, long int nst,
                   realtype hcur, realtype ecur, realtype *hnew)
{
  realtype k1, k2, e1, e2, hrat, h_acc;

  /* modified method for first step */
  if (nst < 2) {

    k1 = -ONE / k;
    e1 = SUNMAX(ecur, TINY);
    h_acc = hcur * SUNRpowerR(e1,k1);

  /* general estimate */
  } else {

    k1 = -hadapt_mem->k1 / k;
    k2 = -hadapt_mem->k2 / k;
    e1 = SUNMAX(ecur, TINY);
    e2 = e1 / SUNMAX(hadapt_mem->ehist[0], TINY);
    hrat = hcur / hadapt_mem->hhist[0];
    h_acc = hcur * hrat * SUNRpowerR(e1,k1) * SUNRpowerR(e2,k2);

  }
  *hnew = h_acc;

  return(ARK_SUCCESS);
}